

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LDLt(TPZMatrix<std::complex<double>_> *this)

{
  byte bVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  double in_XMM1_Qa;
  undefined1 local_b8 [24];
  ulong local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  ulong local_50;
  ulong local_48;
  double local_40;
  undefined8 local_38;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
  }
  uVar3 = (uint)(this->super_TPZBaseMatrix).fRow;
  if (0 < (int)uVar3) {
    local_a0 = (ulong)(uVar3 & 0x7fffffff);
    local_50 = 1;
    uVar4 = 0;
    do {
      if (uVar4 == 0) {
        local_98 = ZEXT816(0);
      }
      else {
        local_98 = ZEXT816(0);
        uVar6 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar6);
          local_88 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          local_78 = in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar4);
          in_XMM1_Qa = -in_XMM1_Qa;
          local_b8._8_8_ = local_78;
          local_b8._0_8_ = local_88;
          local_60._8_8_ = in_XMM1_Qa;
          std::complex<double>::operator*=((complex<double> *)local_b8,(complex<double> *)local_60);
          local_88 = local_b8._0_8_;
          uStack_80 = local_b8._8_4_;
          uStack_7c = local_b8._12_4_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar4);
          local_b8._12_4_ = uStack_7c;
          local_b8._8_4_ = uStack_80;
          local_b8._0_8_ = local_88;
          local_70._8_8_ = in_XMM1_Qa;
          std::complex<double>::operator*=((complex<double> *)local_b8,(complex<double> *)local_70);
          dVar2 = (double)local_98._8_8_ + (double)local_b8._8_8_;
          local_98._8_4_ = SUB84(dVar2,0);
          local_98._0_8_ = (double)local_98._0_8_ + (double)local_b8._0_8_;
          local_98._12_4_ = (int)((ulong)dVar2 >> 0x20);
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
      local_b8._8_4_ = SUB84(in_XMM1_Qa - (double)local_98._8_8_,0);
      local_b8._0_8_ =
           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) - (double)local_98._0_8_;
      local_b8._12_4_ = (int)((ulong)(in_XMM1_Qa - (double)local_98._8_8_) >> 0x20);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar4,uVar4,local_b8);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
      local_38 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      local_40 = in_XMM1_Qa;
      dVar2 = cabs((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      in_XMM1_Qa = 1e-12;
      if (ABS(dVar2) < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_48 = uVar4 + 1;
      uVar6 = local_50;
      if (local_48 < local_a0) {
        do {
          if (uVar4 == 0) {
            local_98 = ZEXT816(0);
          }
          else {
            local_98 = ZEXT816(0);
            uVar5 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar5,uVar5);
              local_88 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
              local_78 = in_XMM1_Qa;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar4,uVar5);
              in_XMM1_Qa = -in_XMM1_Qa;
              local_b8._8_8_ = local_78;
              local_b8._0_8_ = local_88;
              local_60._8_8_ = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)local_b8,(complex<double> *)local_60);
              local_88 = local_b8._0_8_;
              uStack_80 = local_b8._8_4_;
              uStack_7c = local_b8._12_4_;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar6,uVar5);
              local_b8._12_4_ = uStack_7c;
              local_b8._8_4_ = uStack_80;
              local_b8._0_8_ = local_88;
              local_70._8_8_ = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)local_b8,(complex<double> *)local_70);
              dVar2 = (double)local_98._8_8_ + (double)local_b8._8_8_;
              local_98._8_4_ = SUB84(dVar2,0);
              local_98._0_8_ = (double)local_98._0_8_ + (double)local_b8._0_8_;
              local_98._12_4_ = (int)((ulong)dVar2 >> 0x20);
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar4);
          in_XMM1_Qa = in_XMM1_Qa - (double)local_98._8_8_;
          local_b8._0_8_ =
               __divdc3(SUB84((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03) -
                              (double)local_98._0_8_,0),in_XMM1_Qa,local_38,local_40);
          local_b8._8_8_ = in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar6,uVar4,local_b8);
          local_b8._8_8_ = -(double)local_b8._8_8_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar4,uVar6,local_b8);
          uVar6 = uVar6 + 1;
        } while (uVar6 != local_a0);
      }
      local_50 = local_50 + 1;
      uVar4 = local_48;
    } while (local_48 != local_a0);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}